

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistoryTrackerTests.cpp
# Opt level: O0

void __thiscall
solitaire::archivers::HistoryTrackerTests_onSaveShouldThrowIfPassedNullptr_Test::TestBody
          (HistoryTrackerTests_onSaveShouldThrowIfPassedNullptr_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_98;
  Message local_90 [2];
  runtime_error *anon_var_0;
  type e;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  local_50;
  byte local_45;
  bool gtest_caught_expected;
  undefined1 auStack_38 [8];
  TrueWithString gtest_msg;
  HistoryTrackerTests_onSaveShouldThrowIfPassedNullptr_Test *this_local;
  
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_38 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_38);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_38);
  if (bVar1) {
    local_45 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::
      unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>
      ::unique_ptr<std::default_delete<solitaire::archivers::interfaces::Snapshot>,void>
                ((unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>
                  *)&local_50,(nullptr_t)0x0);
      HistoryTracker::save(&(this->super_HistoryTrackerTests).historyTracker,&local_50);
      std::
      unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
      ::~unique_ptr(&local_50);
    }
    if ((local_45 & 1) != 0) goto LAB_00203a0f;
    std::__cxx11::string::operator=
              ((string *)auStack_38,
               "Expected: historyTracker.save(nullptr) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_90);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/archivers/HistoryTrackerTests.cpp"
             ,0x1c,message);
  testing::internal::AssertHelper::operator=(&local_98,local_90);
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  testing::Message::~Message(local_90);
LAB_00203a0f:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_38);
  return;
}

Assistant:

TEST_F(HistoryTrackerTests, onSaveShouldThrowIfPassedNullptr) {
    EXPECT_THROW(historyTracker.save(nullptr), std::runtime_error);
}